

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

bool ensure_file_is_writable(char *pFilename)

{
  FILE *__stream;
  char *in_RDI;
  FILE *pFile;
  int i;
  int cNumRetries;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    if (7 < local_18) {
      return false;
    }
    __stream = fopen64(in_RDI,"wb");
    if (__stream != (FILE *)0x0) break;
    usleep(250000);
    local_18 = local_18 + 1;
  }
  fclose(__stream);
  return true;
}

Assistant:

static bool ensure_file_is_writable(const char *pFilename)
{
   const int cNumRetries = 8;
   for (int i = 0; i < cNumRetries; i++)
   {
      FILE *pFile = fopen(pFilename, "wb");
      if (pFile)
      {
         fclose(pFile);
         return true;
      }
      Sleep(250);
   }
   return false;
}